

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fFirst)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  
  iVar1 = Acb_ObjTravIdDiff(p,iObj);
  iVar2 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar2 != 0) {
    return;
  }
  if (iVar1 == 2) {
    Vec_IntPush(vRoots,iObj);
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("Diff == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x272,
                    "void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int)");
    }
    iVar1 = 0;
    while( true ) {
      pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
      if (pVVar5->nSize <= iVar1) break;
      pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar2 = Vec_IntEntry(pVVar5,iVar1);
      AVar3 = Acb_ObjType(p,iVar2);
      if (AVar3 != ABC_OPER_NONE) {
        if (fFirst != 0) {
          iVar4 = Acb_ObjIsDelayCriticalFanin(p,iVar2,iObj);
          if (iVar4 == 0) goto LAB_003314bb;
        }
        Acb_ObjDeriveTfo_rec(p,iVar2,vTfo,vRoots,0);
      }
LAB_003314bb:
      iVar1 = iVar1 + 1;
    }
  }
  Vec_IntPush(vTfo,iObj);
  return;
}

Assistant:

void Acb_ObjDeriveTfo_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fFirst )
{
    int iFanout, i, Diff = Acb_ObjTravIdDiff(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Diff == 2 ) // root
    {
        Vec_IntPush( vRoots, iObj );
        Vec_IntPush( vTfo, iObj );
        return;
    }
    assert( Diff == 1 );
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            Acb_ObjDeriveTfo_rec( p, iFanout, vTfo, vRoots, 0 );
    Vec_IntPush( vTfo, iObj );
}